

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

void __thiscall
cmCTestSVN::GuessBase
          (cmCTestSVN *this,SVNInfo *svninfo,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  char cVar5;
  pointer pCVar6;
  string local_70;
  string base;
  
  cVar5 = (char)&svninfo->URL;
  lVar3 = std::__cxx11::string::find(cVar5,0x2f);
  psVar1 = &svninfo->Base;
  while ((lVar3 != -1 && ((svninfo->Base)._M_string_length == 0))) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&svninfo->URL);
    cmCTest::DecodeURL(&base,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    for (pCVar6 = (changes->
                  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ((svninfo->Base)._M_string_length == 0 &&
        (pCVar6 != (changes->
                   super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                   )._M_impl.super__Vector_impl_data._M_finish)); pCVar6 = pCVar6 + 1) {
      bVar2 = cmCTestSVNPathStarts(&pCVar6->Path,&base);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)psVar1);
      }
    }
    std::__cxx11::string::~string((string *)&base);
    lVar3 = std::__cxx11::string::find(cVar5,0x2f);
  }
  std::__cxx11::string::append((char *)psVar1);
  poVar4 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Guessed Base = ");
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  std::operator<<(poVar4,"\n");
  return;
}

Assistant:

void cmCTestSVN::GuessBase(SVNInfo& svninfo,
                           std::vector<Change> const& changes)
{
  // Subversion did not give us a good repository root so we need to
  // guess the base path from the URL and the paths in a revision with
  // changes under it.

  // Consider each possible URL suffix from longest to shortest.
  for(std::string::size_type slash = svninfo.URL.find('/');
      svninfo.Base.empty() && slash != std::string::npos;
      slash = svninfo.URL.find('/', slash+1))
    {
    // If the URL suffix is a prefix of at least one path then it is the base.
    std::string base = cmCTest::DecodeURL(svninfo.URL.substr(slash));
    for(std::vector<Change>::const_iterator ci = changes.begin();
        svninfo.Base.empty() && ci != changes.end(); ++ci)
      {
      if(cmCTestSVNPathStarts(ci->Path, base))
        {
        svninfo.Base = base;
        }
      }
    }

  // We always append a slash so that we know paths beginning in the
  // base lie under its path.  If no base was found then the working
  // tree must be a checkout of the entire repo and this will match
  // the leading slash in all paths.
  svninfo.Base += "/";

  this->Log << "Guessed Base = " << svninfo.Base << "\n";
}